

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * kj::_::
       fill<kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                 (char *target,FixedArray<char,_1UL> *first,CappedArray<char,_14UL> *rest,
                 FixedArray<char,_1UL> *rest_1,ArrayPtr<const_char> *rest_2,
                 ArrayPtr<const_char> *rest_3)

{
  char *pcVar1;
  CappedArray<char,_14UL> *first_00;
  FixedArray<char,_1UL> *rest_00;
  ArrayPtr<const_char> *rest_1_00;
  ArrayPtr<const_char> *rest_2_00;
  char *end;
  char *i;
  ArrayPtr<const_char> *rest_local_3;
  ArrayPtr<const_char> *rest_local_2;
  FixedArray<char,_1UL> *rest_local_1;
  CappedArray<char,_14UL> *rest_local;
  FixedArray<char,_1UL> *first_local;
  char *target_local;
  
  end = FixedArray<char,_1UL>::begin(first);
  pcVar1 = FixedArray<char,_1UL>::end(first);
  first_local = (FixedArray<char,_1UL> *)target;
  while (end != pcVar1) {
    first_local->content[0] = *end;
    end = end + 1;
    first_local = first_local + 1;
  }
  first_00 = fwd<kj::CappedArray<char,14ul>>(rest);
  rest_00 = fwd<kj::FixedArray<char,1ul>>(rest_1);
  rest_1_00 = fwd<kj::ArrayPtr<char_const>>(rest_2);
  rest_2_00 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  pcVar1 = fill<kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                     (first_local->content,first_00,rest_00,rest_1_00,rest_2_00);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}